

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * comma_print(unsigned_long n)

{
  code *pcVar1;
  char cVar2;
  lconv *plVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  
  if (0xf < commaPrintBufIndex) {
    commaPrintBufIndex = '\0';
  }
  pcVar6 = (char *)((long)commaPrintBufs +
                   (ulong)commaPrintBufIndex * 0x20 + (ulong)commaPrintBufIndex * -2 + 0x1d);
  plVar3 = localeconv();
  uVar4 = 0;
  if (plVar3 == (lconv *)0x0) {
    cVar2 = '\0';
  }
  else if ((plVar3->thousands_sep == (char *)0x0) || (cVar2 = *plVar3->thousands_sep, cVar2 == '\0')
          ) {
    cVar2 = ',';
  }
  *pcVar6 = '\0';
  iVar5 = 0;
  while( true ) {
    if ((uVar4 != 0) && ((uVar4 / 3) * 3 + iVar5 == 0)) {
      pcVar6[-1] = cVar2;
      pcVar6 = pcVar6 + -1;
    }
    pcVar6[-1] = (char)n + (char)(n / 10) * -10 | 0x30;
    bVar7 = SCARRY4(uVar4,1);
    uVar4 = uVar4 + 1;
    if (bVar7) break;
    pcVar6 = pcVar6 + -1;
    iVar5 = iVar5 + -1;
    bVar7 = n < 10;
    n = n / 10;
    if (bVar7) {
      commaPrintBufIndex = commaPrintBufIndex + '\x01';
      return pcVar6;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

char * comma_print(unsigned long n)
{
	int comma = '\0';
	char *p;
	int i = 0;

	if(commaPrintBufIndex>=16)
		commaPrintBufIndex = 0;

	p = &commaPrintBufs[commaPrintBufIndex][sizeof(commaPrintBufs[commaPrintBufIndex])-1];

	if(comma == '\0')
	{
		struct lconv *lcp = localeconv();
		if(lcp != NULL)
		{
			if(lcp->thousands_sep != NULL && *lcp->thousands_sep != '\0')
				comma = *lcp->thousands_sep;
			else
				comma = ',';
		}
	}

	*p = '\0';

	do
	{
		if(i%3 == 0 && i != 0)
			*--p = comma;

		*--p = '0' + n % 10;
		n /= 10;
		i++;
	} while(n != 0);

	commaPrintBufIndex++;
	return p;
}